

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O2

double __thiscall FNodeBuilder::AddIntersection(FNodeBuilder *this,node_t *node,int vertex)

{
  undefined4 uVar1;
  undefined4 uVar2;
  FSimpleVert FVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double key;
  FEvent *pFVar6;
  FEventTree *this_00;
  
  FVar3 = (this->Vertices).Array[vertex].super_FSimpleVert;
  uVar1 = node->x;
  uVar4 = node->y;
  uVar2 = node->dx;
  uVar5 = node->dy;
  key = (double)(int)uVar5 * ((double)FVar3.y - (double)(int)uVar4) +
        (double)(int)uVar2 * ((double)FVar3.x - (double)(int)uVar1);
  this_00 = &this->Events;
  pFVar6 = FEventTree::FindEvent(this_00,key);
  if (pFVar6 == (FEvent *)0x0) {
    pFVar6 = FEventTree::GetNewNode(this_00);
    pFVar6->Distance = key;
    (pFVar6->Info).Vertex = -1;
    (pFVar6->Info).FrontSeg = 0xffffffff;
    (pFVar6->Info).Vertex = vertex;
    FEventTree::Insert(this_00,pFVar6);
  }
  return key;
}

Assistant:

double FNodeBuilder::AddIntersection (const node_t &node, int vertex)
{
	static const FEventInfo defaultInfo =
	{
		-1, DWORD_MAX
	};

	// Calculate signed distance of intersection vertex from start of splitter.
	// Only ordering is important, so we don't need a sqrt.
	FPrivVert *v = &Vertices[vertex];
	double dist = (double(v->x) - node.x)*(node.dx) + (double(v->y) - node.y)*(node.dy);

	FEvent *event = Events.FindEvent (dist);
	if (event == NULL)
	{
		event = Events.GetNewNode ();
		event->Distance = dist;
		event->Info = defaultInfo;
		event->Info.Vertex = vertex;
		Events.Insert (event);
	}
	return dist;
}